

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O3

void __thiscall menu::~menu(menu *this)

{
  ~menu(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

menu::~menu() {
	for (auto *ptr : opciones) {
		delete ptr;
	}
}